

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpData.cpp
# Opt level: O1

HeaderState __thiscall HttpData::parseHeaders(HttpData *this)

{
  string *this_00;
  char cVar1;
  pointer pcVar2;
  HeaderState HVar3;
  mapped_type *this_01;
  ulong __pos;
  bool bVar4;
  ulong uVar5;
  int iVar6;
  size_type __pos_00;
  string key;
  string value;
  int local_88;
  int local_84;
  int local_80;
  key_type local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_38;
  
  this_00 = &this->inBuffer_;
  __pos = 0;
  if ((this->inBuffer_)._M_string_length == 0) {
    __pos_00 = 0;
  }
  else {
    local_38 = &this->headers_;
    bVar4 = true;
    uVar5 = 0xffffffff;
    local_84 = -1;
    local_88 = -1;
    __pos_00 = 0;
    local_80 = -1;
    do {
      iVar6 = (int)__pos_00;
      switch(this->hState_) {
      case H_START:
        cVar1 = (this_00->_M_dataplus)._M_p[__pos_00];
        if ((cVar1 != '\n') && (cVar1 != '\r')) {
          this->hState_ = H_KEY;
          goto LAB_0010947c;
        }
        break;
      case H_KEY:
        cVar1 = (this_00->_M_dataplus)._M_p[__pos_00];
        if (cVar1 == ':') {
          if (iVar6 <= (int)uVar5) {
            return PARSE_HEADER_ERROR;
          }
          this->hState_ = H_COLON;
          local_84 = iVar6;
        }
        else {
          if (cVar1 == '\n') {
            return PARSE_HEADER_ERROR;
          }
          if (cVar1 == '\r') {
            return PARSE_HEADER_ERROR;
          }
        }
        break;
      case H_COLON:
        if ((this_00->_M_dataplus)._M_p[__pos_00] != ' ') {
          return PARSE_HEADER_ERROR;
        }
        this->hState_ = H_SPACES_AFTER_COLON;
        break;
      case H_SPACES_AFTER_COLON:
        this->hState_ = H_VALUE;
        local_88 = iVar6;
        break;
      case H_VALUE:
        if ((this_00->_M_dataplus)._M_p[__pos_00] == '\r') {
          this->hState_ = H_CR;
          local_80 = iVar6;
          if (iVar6 <= local_88) {
            return PARSE_HEADER_ERROR;
          }
        }
        else if (0xff < __pos_00 - (long)local_88) {
          return PARSE_HEADER_ERROR;
        }
        break;
      case H_CR:
        pcVar2 = (this_00->_M_dataplus)._M_p;
        if (pcVar2[__pos_00] != '\n') {
          return PARSE_HEADER_ERROR;
        }
        this->hState_ = H_LF;
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                  ((string *)&local_78,pcVar2 + (int)uVar5,pcVar2 + local_84);
        pcVar2 = (this->inBuffer_)._M_dataplus._M_p;
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                  ((string *)&local_58,pcVar2 + local_88,pcVar2 + local_80);
        this_01 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](local_38,&local_78);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (this_01,&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        __pos = __pos_00 & 0xffffffff;
        break;
      case H_LF:
        if ((this_00->_M_dataplus)._M_p[__pos_00] != '\r') {
          this->hState_ = H_KEY;
          goto LAB_001094a1;
        }
        this->hState_ = H_END_CR;
        break;
      case H_END_CR:
        if ((this_00->_M_dataplus)._M_p[__pos_00] != '\n') {
          return PARSE_HEADER_ERROR;
        }
        this->hState_ = H_END_LF;
        break;
      case H_END_LF:
        bVar4 = false;
LAB_0010947c:
        __pos = __pos_00 & 0xffffffff;
LAB_001094a1:
        uVar5 = __pos_00 & 0xffffffff;
      }
      __pos_00 = __pos_00 + 1;
    } while ((__pos_00 < (this->inBuffer_)._M_string_length) && (bVar4));
    __pos = (ulong)(int)__pos;
  }
  if (this->hState_ == H_END_LF) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_78,this_00,__pos_00,0xffffffffffffffff);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (this_00,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    HVar3 = PARSE_HEADER_SUCCESS;
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_78,this_00,__pos,0xffffffffffffffff);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (this_00,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    HVar3 = PARSE_HEADER_AGAIN;
  }
  return HVar3;
}

Assistant:

HeaderState HttpData::parseHeaders() {
  string &str = inBuffer_;
  int key_start = -1, key_end = -1, value_start = -1, value_end = -1;
  int now_read_line_begin = 0;
  bool notFinish = true;
  size_t i = 0;
  for (; i < str.size() && notFinish; ++i) {
    switch (hState_) {
      case H_START: {
        if (str[i] == '\n' || str[i] == '\r') break;
        hState_ = H_KEY;
        key_start = i;
        now_read_line_begin = i;
        break;
      }
      case H_KEY: {
        if (str[i] == ':') {
          key_end = i;
          if (key_end - key_start <= 0) return PARSE_HEADER_ERROR;
          hState_ = H_COLON;
        } else if (str[i] == '\n' || str[i] == '\r')
          return PARSE_HEADER_ERROR;
        break;
      }
      case H_COLON: {
        if (str[i] == ' ') {
          hState_ = H_SPACES_AFTER_COLON;
        } else
          return PARSE_HEADER_ERROR;
        break;
      }
      case H_SPACES_AFTER_COLON: {
        hState_ = H_VALUE;
        value_start = i;
        break;
      }
      case H_VALUE: {
        if (str[i] == '\r') {
          hState_ = H_CR;
          value_end = i;
          if (value_end - value_start <= 0) return PARSE_HEADER_ERROR;
        } else if (i - value_start > 255)
          return PARSE_HEADER_ERROR;
        break;
      }
      case H_CR: {
        if (str[i] == '\n') {
          hState_ = H_LF;
          string key(str.begin() + key_start, str.begin() + key_end);
          string value(str.begin() + value_start, str.begin() + value_end);
          headers_[key] = value;
          now_read_line_begin = i;
        } else
          return PARSE_HEADER_ERROR;
        break;
      }
      case H_LF: {
        if (str[i] == '\r') {
          hState_ = H_END_CR;
        } else {
          key_start = i;
          hState_ = H_KEY;
        }
        break;
      }
      case H_END_CR: {
        if (str[i] == '\n') {
          hState_ = H_END_LF;
        } else
          return PARSE_HEADER_ERROR;
        break;
      }
      case H_END_LF: {
        notFinish = false;
        key_start = i;
        now_read_line_begin = i;
        break;
      }
    }
  }
  if (hState_ == H_END_LF) {
    str = str.substr(i);
    return PARSE_HEADER_SUCCESS;
  }
  str = str.substr(now_read_line_begin);
  return PARSE_HEADER_AGAIN;
}